

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O2

void __thiscall
gmlc::utilities::string_viewOps::trim
          (string_viewOps *this,string_viewVector *input,string_view trimCharacters)

{
  string_view *psVar1;
  basic_string_view<char,_std::char_traits<char>_> *istr;
  string_view *psVar2;
  string_view sVar3;
  
  psVar1 = *(string_view **)(this + 8);
  for (psVar2 = *(string_view **)this; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    sVar3._M_str = (char *)trimCharacters._M_len;
    sVar3._M_len = (size_t)input;
    sVar3 = trim(*psVar2,sVar3);
    *psVar2 = sVar3;
  }
  return;
}

Assistant:

void trim(string_viewVector& input, std::string_view trimCharacters)
{
    for (auto& istr : input) {
        istr = trim(istr, trimCharacters);
    }
}